

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

filter_info * add_new_filter(rar5 *rar)

{
  void *item;
  filter_info *f;
  rar5 *rar_local;
  
  rar_local = (rar5 *)calloc(1,0x28);
  if (rar_local == (rar5 *)0x0) {
    rar_local = (rar5 *)0x0;
  }
  else {
    item = cdeque_filter((filter_info *)rar_local);
    cdeque_push_back(&(rar->cstate).filters,item);
  }
  return (filter_info *)rar_local;
}

Assistant:

static struct filter_info* add_new_filter(struct rar5* rar) {
	struct filter_info* f =
		(struct filter_info*) calloc(1, sizeof(struct filter_info));

	if(!f) {
		return NULL;
	}

	cdeque_push_back(&rar->cstate.filters, cdeque_filter(f));
	return f;
}